

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O0

Var Js::CrossSite::MarshalVarInner
              (ScriptContext *scriptContext,RecyclableObject *object,bool fRequestWrapper)

{
  code *pcVar1;
  bool bVar2;
  TypeId typeId_00;
  BOOL BVar3;
  int iVar4;
  ScriptContext *pSVar5;
  JavascriptLibrary *pJVar6;
  RecyclableObject *pRVar7;
  ThreadContext *pTVar8;
  ThreadContext *pTVar9;
  undefined4 *puVar10;
  Recycler *this;
  undefined4 extraout_var;
  HostObjectBase *pHVar11;
  Var value;
  JavascriptFunction *pJVar12;
  DynamicObject *dynamicObject;
  Var hostDispatch;
  HostObjectBase *hostObject;
  RootObjectBase *moduleRoot;
  TypeId typeId;
  undefined1 local_48 [8];
  JsReentLock jsReentLock;
  bool fRequestWrapper_local;
  RecyclableObject *object_local;
  ScriptContext *scriptContext_local;
  
  jsReentLock._31_1_ = fRequestWrapper;
  pSVar5 = RecyclableObject::GetScriptContext(object);
  if (scriptContext == pSVar5) {
    bVar2 = DoRequestWrapper(object,(bool)(jsReentLock._31_1_ & 1));
    if (!bVar2) {
      return object;
    }
    pJVar6 = ScriptContext::GetLibrary(scriptContext);
    pRVar7 = JavascriptLibraryBase::GetUndefined(&pJVar6->super_JavascriptLibraryBase);
    return pRVar7;
  }
  pTVar8 = ScriptContext::GetThreadContext(scriptContext);
  pSVar5 = RecyclableObject::GetScriptContext(object);
  pTVar9 = ScriptContext::GetThreadContext(pSVar5);
  if (pTVar8 != pTVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0xf0,
                                "(scriptContext->GetThreadContext() == object->GetScriptContext()->GetThreadContext())"
                                ,
                                "ScriptContexts should belong to same threadcontext for marshalling."
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  this = ScriptContext::GetRecycler(scriptContext);
  bVar2 = Memory::Recycler::IsHeapEnumInProgress(this);
  if (bVar2) {
    return object;
  }
  bVar2 = ScriptContext::IsTTDSnapshotOrInflateInProgress(scriptContext);
  if (bVar2) {
    return object;
  }
  pTVar8 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_48,pTVar8);
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(object);
  typeId_00 = RecyclableObject::GetTypeId(object);
  if (typeId_00 == TypeIds_Enumerator) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x107,"(typeId != TypeIds_Enumerator)",
                                "enumerator shouldn\'t be marshalled here");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  if (typeId_00 == TypeIds_UnscopablesWrapperObject) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/CrossSite.cpp"
                                ,0x113,"(typeId != TypeIds_UnscopablesWrapperObject)",
                                "UnscopablesWrapperObject shouldn\'t be marshalled here");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  bVar2 = StaticType::Is(typeId_00);
  if (bVar2) {
    iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x58])(object,scriptContext);
    scriptContext_local = (ScriptContext *)CONCAT44(extraout_var,iVar4);
  }
  else if ((typeId_00 == TypeIds_LastTrueJavascriptObjectType) &&
          (pHVar11 = RootObjectBase::GetHostObject((RootObjectBase *)object),
          pHVar11 != (HostObjectBase *)0x0)) {
    value = (Var)(**(code **)(*(long *)pHVar11 + 0x2b8))();
    scriptContext_local = (ScriptContext *)MarshalVar(scriptContext,value,false);
  }
  else {
    if (typeId_00 == TypeIds_Function) {
      pSVar5 = RecyclableObject::GetScriptContext(object);
      pJVar6 = ScriptContext::GetLibrary(pSVar5);
      pJVar12 = JavascriptLibrary::GetDefaultAccessorFunction(pJVar6);
      if ((JavascriptFunction *)object == pJVar12) {
        pJVar6 = ScriptContext::GetLibrary(scriptContext);
        scriptContext_local = (ScriptContext *)JavascriptLibrary::GetDefaultAccessorFunction(pJVar6)
        ;
        goto LAB_00a0c1ee;
      }
      bVar2 = DoRequestWrapper(object,(bool)(jsReentLock._31_1_ & 1));
      if (bVar2) {
        MarshalVarInner(scriptContext,object,false);
        pJVar6 = ScriptContext::GetLibrary(scriptContext);
        scriptContext_local =
             (ScriptContext *)
             JavascriptLibrary::CreateWrappedExternalFunction
                       (pJVar6,(JavascriptExternalFunction *)object);
        goto LAB_00a0c1ee;
      }
    }
    pSVar5 = RecyclableObject::GetScriptContext(object);
    ScriptContextOptimizationOverrideInfo::Merge
              (&scriptContext->optimizationOverrides,&pSVar5->optimizationOverrides);
    scriptContext_local = (ScriptContext *)VarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    BVar3 = RecyclableObject::IsExternal((RecyclableObject *)scriptContext_local);
    if (BVar3 == 0) {
      iVar4 = (*(((RecyclableObject *)&scriptContext_local->super_ScriptContextInfo)->
                super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x66])();
      if (iVar4 == 0) {
        bVar2 = VarIs<Js::JavascriptProxy,Js::DynamicObject>((DynamicObject *)scriptContext_local);
        if (bVar2) {
          MarshalDynamicObject(scriptContext,(DynamicObject *)scriptContext_local);
        }
        else {
          MarshalDynamicObjectAndPrototype(scriptContext,(DynamicObject *)scriptContext_local);
        }
      }
    }
    else {
      MarshalPrototypeChain(scriptContext,(DynamicObject *)scriptContext_local);
      bVar2 = JavascriptConversion::IsCallable((RecyclableObject *)scriptContext_local);
      if (bVar2) {
        (*(((RecyclableObject *)&scriptContext_local->super_ScriptContextInfo)->
          super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x61])
                  (scriptContext_local,scriptContext);
      }
    }
  }
LAB_00a0c1ee:
  JsReentLock::~JsReentLock((JsReentLock *)local_48);
  return scriptContext_local;
}

Assistant:

Var CrossSite::MarshalVarInner(ScriptContext* scriptContext, __in Js::RecyclableObject* object, bool fRequestWrapper)
    {
        if (scriptContext == object->GetScriptContext())
        {
            if (DoRequestWrapper(object, fRequestWrapper))
            {
                // If we get here then we need to either wrap in the caller's type system or we need to return undefined.
                // VBScript will pass in the scriptContext (requestContext) from the JavascriptDispatch and this will be the
                // same as the object's script context and so we have to safely pretend this value doesn't exist.
                return scriptContext->GetLibrary()->GetUndefined();
            }
            return object;
        }

        AssertMsg(scriptContext->GetThreadContext() == object->GetScriptContext()->GetThreadContext(), "ScriptContexts should belong to same threadcontext for marshalling.");
        // In heapenum, we are traversing through the object graph to dump out the content of recyclable objects. The content
        // of the objects are duplicated to the heapenum result, and we are not storing/changing the object graph during heap enum.
        // We don't actually need to do cross site thunk here.
        if (scriptContext->GetRecycler()->IsHeapEnumInProgress())
        {
            return object;
        }

#if ENABLE_TTD
        if (scriptContext->IsTTDSnapshotOrInflateInProgress())
        {
            return object;
        }
#endif

        // Marshaling should not cause any re-entrancy.
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(object);
#endif
        TypeId typeId = object->GetTypeId();
        AssertMsg(typeId != TypeIds_Enumerator, "enumerator shouldn't be marshalled here");

        // At the moment the mental model for UnscopablesWrapperObject Marshaling is this:
        // Are we trying to marshal a UnscopablesWrapperObject in the Frame Display? - then 1) unwrap in MarshalFrameDisplay,
        // 2) marshal the wrapped object, 3) Create a new UnscopablesWrapperObject in the current scriptContext and re-wrap.
        // We can avoid copying the UnscopablesWrapperObject because it has no properties and never should.
        // Thus creating a new UnscopablesWrapperObject per context in MarshalFrameDisplay should be kosher.
        // If it is not a FrameDisplay then we should not marshal. We can wrap cross context objects with a
        // UnscopablesWrapperObject in a different context. When we unwrap for property lookups and the wrapped object
        // is cross context, then we marshal the wrapped object into the current scriptContext, thus avoiding
        // the need to copy the UnscopablesWrapperObject itself. Thus We don't have to handle marshaling the UnscopablesWrapperObject
        // in non-FrameDisplay cases.
        AssertMsg(typeId != TypeIds_UnscopablesWrapperObject, "UnscopablesWrapperObject shouldn't be marshalled here");

        if (StaticType::Is(typeId))
        {
            TTD_XSITE_LOG(object->GetScriptContext(), "CloneToScriptContext", object);

            return object->CloneToScriptContext(scriptContext);
        }

        if (typeId == TypeIds_ModuleRoot)
        {
            RootObjectBase *moduleRoot = static_cast<RootObjectBase*>(object);
            HostObjectBase * hostObject = moduleRoot->GetHostObject();

            // When marshaling module root, all we need is the host object.
            // So, if the module root which is being marshaled has host object, marshal it.
            if (hostObject)
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "hostObject", hostObject);

                Var hostDispatch = hostObject->GetHostDispatchVar();
                return CrossSite::MarshalVar(scriptContext, hostDispatch);
            }
        }

        if (typeId == TypeIds_Function)
        {
            if (object == object->GetScriptContext()->GetLibrary()->GetDefaultAccessorFunction() )
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "DefaultAccessorFunction", object);

                return scriptContext->GetLibrary()->GetDefaultAccessorFunction();
            }

            if (DoRequestWrapper(object, fRequestWrapper))
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "CreateWrappedExternalFunction", object);

                // Marshal as a cross-site thunk if necessary before re-wrapping in an external function thunk.
                MarshalVarInner(scriptContext, object, false);
                return scriptContext->GetLibrary()->CreateWrappedExternalFunction(static_cast<JavascriptExternalFunction*>(object));
            }
        }

        // We have an object marshaled, we need to keep track of the related script context
        // so optimization overrides can be updated as a group
        scriptContext->optimizationOverrides.Merge(&object->GetScriptContext()->optimizationOverrides);

        DynamicObject * dynamicObject = VarTo<DynamicObject>(object);
        if (!dynamicObject->IsExternal())
        {
            if (!dynamicObject->IsCrossSiteObject())
            {
                if (VarIs<JavascriptProxy>(dynamicObject))
                {
                    // We don't need to marshal the prototype chain in the case of Proxy. Otherwise we will go to the user code.
                    TTD_XSITE_LOG(object->GetScriptContext(), "MarshalDynamicObject", object);
                    MarshalDynamicObject(scriptContext, dynamicObject);
                }
                else
                {
                    TTD_XSITE_LOG(object->GetScriptContext(), "MarshalDynamicObjectAndPrototype", object);

                    MarshalDynamicObjectAndPrototype(scriptContext, dynamicObject);
                }
            }
        }
        else
        {
            MarshalPrototypeChain(scriptContext, dynamicObject);
            if (Js::JavascriptConversion::IsCallable(dynamicObject))
            {
                TTD_XSITE_LOG(object->GetScriptContext(), "MarshalToScriptContext", object);

                dynamicObject->MarshalToScriptContext(scriptContext);
            }
        }

        return dynamicObject;
    }